

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O2

enum_type __thiscall
stored_enum<setup::(anonymous_namespace)::stored_bool_auto_no_yes>::get
          (stored_enum<setup::(anonymous_namespace)::stored_bool_auto_no_yes> *this)

{
  enum_type eVar1;
  logger *this_00;
  logger local_190;
  
  if (this->value < 3) {
    eVar1 = *(enum_type *)
             (setup::(anonymous_namespace)::stored_language_detection_method::values +
             this->value * 4);
  }
  else {
    local_190.level = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190.buffer);
    std::operator<<((ostream *)&local_190.buffer,"Unexpected ");
    this_00 = logger::operator<<(&local_190,&enum_names<setup::header::auto_bool>::name);
    std::operator<<((ostream *)&this_00->buffer," value: ");
    logger::operator<<(this_00,&this->value);
    logger::~logger(&local_190);
    eVar1 = Auto;
  }
  return eVar1;
}

Assistant:

enum_type get() {
		
		if(value < size) {
			return Mapping::values[value];
		}
		
		log_warning << "Unexpected " << enum_names<enum_type>::name << " value: " << value;
		
		return Mapping::default_value;
	}